

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O0

wchar_t recharge_failure_chance(object *obj,wchar_t strength)

{
  wchar_t local_24;
  wchar_t raw_chance;
  wchar_t ease_of_recharge;
  wchar_t strength_local;
  object *obj_local;
  
  local_24 = strength + (100 - obj->kind->level) / 10 +
             ((int)obj->pval / (int)(uint)obj->number) * -2;
  if (local_24 < L'\x02') {
    local_24 = L'\x01';
  }
  return local_24;
}

Assistant:

int recharge_failure_chance(const struct object *obj, int strength) {
	/* Ease of recharge ranges from 9 down to 4 (wands) or 3 (staffs) */
	int ease_of_recharge = (100 - obj->kind->level) / 10;
	int raw_chance = strength + ease_of_recharge
		- 2 * (obj->pval / obj->number);
	return raw_chance > 1 ? raw_chance : 1;
}